

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
ft::
map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::erase(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,iterator *position)

{
  size_type *psVar1;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar2;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar3;
  iterator local_28;
  
  local_28._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113bc0;
  local_28.m_tree = position->m_tree;
  local_28.m_node = position->m_node;
  treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::BSTerase((treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,&local_28);
  psVar1 = &(this->
            super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .m_size;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    ptVar2 = (this->
             super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).
             super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .m_tree.m_first;
    (this->
    super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).
    super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .m_tree.m_root =
         (this->
         super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).
         super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .m_tree.NIL;
    ptVar3 = (this->
             super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).
             super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .m_tree.m_last;
    ptVar2->parent = ptVar3;
    ptVar3->parent = ptVar2;
  }
  return;
}

Assistant:

void	erase(iterator position)
	{
		this->BSTerase(position);

		--this->m_size;
		if (this->empty()) {
			this->treeInit();
		}
	}